

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_gettable(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *t_00;
  TValue *io1;
  TValue *slot;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2addr(L,idx);
  if (t_00->tt_ == 0x45) {
    io1 = luaH_get((Table *)(t_00->value_).gc,L->top + -1);
    if (io1->tt_ != 0) {
      pTVar1 = L->top;
      pTVar1[-1].value_ = io1->value_;
      uVar2 = *(undefined4 *)&io1->field_0xc;
      pTVar1[-1].tt_ = io1->tt_;
      *(undefined4 *)&pTVar1[-1].field_0xc = uVar2;
      goto LAB_00105d99;
    }
  }
  else {
    io1 = (TValue *)0x0;
  }
  luaV_finishget(L,t_00,L->top + -1,L->top + -1,io1);
LAB_00105d99:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  luaV_gettable(L, t, L->top - 1, L->top - 1);
  lua_unlock(L);
  return ttnov(L->top - 1);
}